

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveglsl_tests.cpp
# Opt level: O1

void utest_register_filewatcher_add_watch_modify_2(void)

{
  size_t sVar1;
  char *pcVar2;
  utest_test_state_s *puVar3;
  
  sVar1 = utest_state.tests_length;
  utest_state.tests_length = utest_state.tests_length + 1;
  pcVar2 = (char *)malloc(0x1f);
  puVar3 = (utest_test_state_s *)realloc(utest_state.tests,sVar1 * 0x18 + 0x18);
  utest_state.tests = puVar3;
  puVar3[sVar1].func = utest_filewatcher_add_watch_modify_2;
  puVar3[sVar1].name = pcVar2;
  builtin_strncpy(pcVar2,"filewatcher.add_watch_modify_2",0x1f);
  return;
}

Assistant:

UTEST(filewatcher, add_watch_modify_2) {
    const char* file_path = "test_file.txt";
    std::ofstream file(file_path);
    file << "File dummy content";
    file.close();

    bool callback_called = false;
    HFileWatcher watcher = FileWatcherCreate(OnFileChanged, &callback_called, 100);
    FileWatcherAddWatch(watcher, file_path);

    std::this_thread::sleep_for(std::chrono::milliseconds(1000));

    FileWatcherRemoveWatch(watcher, file_path);

    std::ofstream modified_file(file_path);
    modified_file << "Modified content";
    modified_file.close();

    std::this_thread::sleep_for(std::chrono::milliseconds(200));

    T(!callback_called);

    FileWatcherDestroy(watcher);

    std::remove(file_path);
}